

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

bool __thiscall Shell::Options::OptionValue<bool>::checkConstraints(OptionValue<bool> *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Mode MVar4;
  BadOption BVar5;
  pointer pOVar6;
  ostream *poVar7;
  UserErrorException *pUVar8;
  RefIterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  RefIterator local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::Lib::
  Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>_>
  ::RefIterator::RefIterator(&local_c0,&this->_constraints);
  bVar1 = ::Lib::
          Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>_>
          ::RefIterator::hasNext(&local_c0);
  if (bVar1) {
    do {
      ::Lib::
      Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>_>
      ::RefIterator::next(&local_c0);
      pOVar6 = std::
               unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
               ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                             *)0x770b24);
      iVar3 = (*pOVar6->_vptr_OptionValueConstraint[2])(pOVar6,this);
      if ((char)iVar3 == '\0') {
        MVar4 = mode(::Lib::env);
        if (MVar4 == SPIDER) {
          reportSpiderFail();
          pUVar8 = (UserErrorException *)__cxa_allocate_exception(0x50);
          pOVar6 = std::
                   unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                   ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                                 *)0x770cae);
          (*pOVar6->_vptr_OptionValueConstraint[3])(&local_100,pOVar6,this);
          std::operator+(&local_50,"\nBroken Constraint: ",&local_100);
          ::Lib::UserErrorException::Exception(pUVar8,&local_50);
          __cxa_throw(pUVar8,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pOVar6 = std::
                 unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                 ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                               *)0x770b58);
        bVar2 = OptionValueConstraint<bool>::isHard(pOVar6);
        if (bVar2) {
          pUVar8 = (UserErrorException *)__cxa_allocate_exception(0x50);
          pOVar6 = std::
                   unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                   ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                                 *)0x770d1d);
          (*pOVar6->_vptr_OptionValueConstraint[3])(&local_100,pOVar6,this);
          std::operator+(&local_70,"\nBroken Constraint: ",&local_100);
          ::Lib::UserErrorException::Exception(pUVar8,&local_70);
          __cxa_throw(pUVar8,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        BVar5 = getBadOptionChoice(::Lib::env);
        if (BVar5 != FORCED) {
          if (BVar5 != OFF) {
            if (BVar5 != SOFT) {
              pUVar8 = (UserErrorException *)__cxa_allocate_exception(0x50);
              pOVar6 = std::
                       unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                       ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                                     *)0x770df2);
              (*pOVar6->_vptr_OptionValueConstraint[3])(&local_100,pOVar6,this);
              std::operator+(&local_90,"\nBroken Constraint: ",&local_100);
              ::Lib::UserErrorException::Exception(pUVar8,&local_90);
              __cxa_throw(pUVar8,&::Lib::UserErrorException::typeinfo,
                          ::Lib::UserErrorException::~UserErrorException);
            }
            pOVar6 = std::
                     unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                     ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                                   *)0x770c1d);
            (*pOVar6->_vptr_OptionValueConstraint[3])(&local_e0,pOVar6,this);
            std::operator+(&local_100,"WARNING Broken Constraint: ",&local_e0);
            poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_100);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_e0);
          }
          break;
        }
        pOVar6 = std::
                 unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                 ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                               *)0x770b88);
        iVar3 = (*pOVar6->_vptr_OptionValueConstraint[4])(pOVar6,this);
        if ((char)iVar3 == '\0') {
          pUVar8 = (UserErrorException *)__cxa_allocate_exception(0x50);
          pOVar6 = std::
                   unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                   ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                                 *)0x770d8c);
          (*pOVar6->_vptr_OptionValueConstraint[3])(&local_100,pOVar6,this);
          std::operator+(&local_b0,"\nCould not force Constraint: ",&local_100);
          ::Lib::UserErrorException::Exception(pUVar8,&local_b0);
          __cxa_throw(pUVar8,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        pOVar6 = std::
                 unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                 ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>
                               *)0x770ba4);
        (*pOVar6->_vptr_OptionValueConstraint[3])(&local_e0,pOVar6,this);
        std::operator+(&local_100,"Forced constraint ",&local_e0);
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_100);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      bVar1 = ::Lib::
              Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<bool>,_std::default_delete<Shell::Options::OptionValueConstraint<bool>_>_>_>
              ::RefIterator::hasNext(&local_c0);
    } while (bVar1);
  }
  return (bool)(~bVar1 & 1);
}

Assistant:

bool Options::OptionValue<T>::checkConstraints()
{
  typename Lib::Stack<OptionValueConstraintUP<T>>::RefIterator it(_constraints);
  while (it.hasNext()) {
    const OptionValueConstraintUP<T> &con = it.next();
    if (!con->check(*this)) {

      if (env.options->mode() == Mode::SPIDER) {
      reportSpiderFail();
      USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      }

      if (con->isHard()) {
        USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      }
      switch (env.options->getBadOptionChoice()) {
      case BadOption::HARD:
        USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      case BadOption::SOFT:
        cout << "WARNING Broken Constraint: " + con->msg(*this) << endl;
        return false;
      case BadOption::FORCED:
        if (con->force(this)) {
          cout << "Forced constraint " + con->msg(*this) << endl;
          break;
        }
        else {
          USER_ERROR("\nCould not force Constraint: " + con->msg(*this));
        }
      case BadOption::OFF:
        return false;
      default:
        ASSERTION_VIOLATION;
      }
    }
  }
  return true;
}